

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CArena.cpp
# Opt level: O1

void __thiscall amrex::CArena::free(CArena *this,void *__ptr)

{
  NL *this_00;
  mutex *__mutex;
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Base_ptr p_Var3;
  int iVar4;
  const_iterator __position;
  _Rb_tree_node_base *p_Var5;
  const_iterator __position_00;
  undefined8 uVar6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  _Node_iterator_base<amrex::CArena::Node,_false> __it;
  pair<std::_Rb_tree_iterator<amrex::CArena::Node>,_bool> pVar10;
  
  if (__ptr == (void *)0x0) {
    return;
  }
  __mutex = &this->carena_mutex;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    uVar6 = std::__throw_system_error(iVar4);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar6);
  }
  uVar1 = (this->m_busylist)._M_h._M_bucket_count;
  uVar7 = (ulong)__ptr % uVar1;
  p_Var8 = (this->m_busylist)._M_h._M_buckets[uVar7];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var8->_M_nxt, p_Var9 = p_Var8, p_Var8->_M_nxt[1]._M_nxt != (_Hash_node_base *)__ptr
     )) {
    while (p_Var8 = p_Var2, p_Var2 = p_Var8->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar7) ||
         (p_Var9 = p_Var8, p_Var2[1]._M_nxt == (_Hash_node_base *)__ptr)) goto LAB_00558447;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_00558447:
  if (p_Var9 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var9->_M_nxt;
  }
  if (__it._M_cur == (__node_type *)0x0) {
    Abort_host("CArena::free: unknown pointer");
  }
  else {
    this->m_actually_used = this->m_actually_used - *(long *)((long)__it._M_cur + 0x18);
    this_00 = &this->m_freelist;
    pVar10 = std::
             _Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
             ::_M_insert_unique<amrex::CArena::Node_const&>
                       ((_Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
                         *)this_00,(Node *)((long)__it._M_cur + 8));
    __position._M_node = (_Base_ptr)pVar10.first._M_node;
    std::
    _Hashtable<amrex::CArena::Node,_amrex::CArena::Node,_std::allocator<amrex::CArena::Node>,_std::__detail::_Identity,_std::equal_to<amrex::CArena::Node>,_amrex::CArena::Node::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::erase(&(this->m_busylist)._M_h,(const_iterator)__it._M_cur);
    if (__position._M_node !=
        (this->m_freelist)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(__position._M_node);
      if (((long)&(p_Var5[1]._M_left)->_M_color + *(long *)(p_Var5 + 1) ==
           *(long *)(__position._M_node + 1)) &&
         (p_Var5[1]._M_parent == __position._M_node[1]._M_parent)) {
        p_Var5[1]._M_left =
             (_Base_ptr)
             ((long)&(__position._M_node[1]._M_left)->_M_color +
             (long)&(p_Var5[1]._M_left)->_M_color);
        std::
        _Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
        ::erase_abi_cxx11_((_Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
                            *)this_00,__position);
        __position._M_node = p_Var5;
      }
    }
    p_Var3 = __position._M_node[1]._M_left;
    __position_00._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    if ((((_Rb_tree_header *)__position_00._M_node !=
          &(this->m_freelist)._M_t._M_impl.super__Rb_tree_header) &&
        ((long)&p_Var3->_M_color + *(long *)(__position._M_node + 1) ==
         *(long *)(__position_00._M_node + 1))) &&
       (__position_00._M_node[1]._M_parent == __position._M_node[1]._M_parent)) {
      __position._M_node[1]._M_left =
           (_Base_ptr)
           ((long)&(__position_00._M_node[1]._M_left)->_M_color + (long)&p_Var3->_M_color);
      std::
      _Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
      ::erase_abi_cxx11_((_Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
                          *)this_00,__position_00);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void
CArena::free (void* vp)
{
    if (vp == 0) {
        //
        // Allow calls with NULL as allowed by C++ delete.
        //
        return;
    }

    std::lock_guard<std::mutex> lock(carena_mutex);

    //
    // `vp' had better be in the busy list.
    //
    auto busy_it = m_busylist.find(Node(vp,0,0));
    if (busy_it == m_busylist.end()) {
        amrex::Abort("CArena::free: unknown pointer");
        return;
    }
    BL_ASSERT(m_freelist.find(*busy_it) == m_freelist.end());

    m_actually_used -= busy_it->size();

    //
    // Put free'd block on free list and save iterator to insert()ed position.
    //
    std::pair<NL::iterator,bool> pair_it = m_freelist.insert(*busy_it);

    BL_ASSERT(pair_it.second == true);

    NL::iterator free_it = pair_it.first;

    BL_ASSERT(free_it != m_freelist.end() && (*free_it).block() == (*busy_it).block());
    //
    // And remove from busy list.
    //
    m_busylist.erase(busy_it);
    //
    // Coalesce freeblock(s) on lo and hi side of this block.
    //
    if (!(free_it == m_freelist.begin()))
    {
        NL::iterator lo_it = free_it;

        --lo_it;

        void* addr = static_cast<char*>((*lo_it).block()) + (*lo_it).size();

        if (addr == (*free_it).block() && lo_it->coalescable(*free_it))
        {
            //
            // This cast is needed as iterators to set return const values;
            // i.e. we can't legally change an element of a set.
            // In this case I want to change the size() of a block
            // in the freelist.  Since size() is not used in the ordering
            // relations in the set, this won't effect the order;
            // i.e. it won't muck up the ordering of elements in the set.
            // I don't want to have to remove the element from the set and
            // then reinsert it with a different size() as it'll just go
            // back into the same place in the set.
            //
            Node* node = const_cast<Node*>(&(*lo_it));
            BL_ASSERT(!(node == 0));
            node->size((*lo_it).size() + (*free_it).size());
            m_freelist.erase(free_it);
            free_it = lo_it;
        }
    }

    NL::iterator hi_it = free_it;

    void* addr = static_cast<char*>((*free_it).block()) + (*free_it).size();

    if (++hi_it != m_freelist.end() && addr == (*hi_it).block() && hi_it->coalescable(*free_it))
    {
        //
        // Ditto the above comment.
        //
        Node* node = const_cast<Node*>(&(*free_it));
        BL_ASSERT(!(node == 0));
        node->size((*free_it).size() + (*hi_it).size());
        m_freelist.erase(hi_it);
    }
}